

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&> *
__thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  _func_int **pp_Var1;
  MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *pMVar2;
  linked_ptr_internal *this_00;
  
  pMVar2 = (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)operator_new(0x20);
  (pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MonomorphicImpl_00293598;
  pp_Var1 = *(_func_int ***)this;
  pMVar2[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = pp_Var1;
  this_00 = (linked_ptr_internal *)(pMVar2 + 2);
  if (pp_Var1 == (_func_int **)0x0) {
    this_00->next_ = this_00;
  }
  else {
    internal::linked_ptr_internal::join(this_00,(linked_ptr_internal *)(this + 8));
  }
  *(PolymorphicMatcher *)(pMVar2 + 3) = this[0x10];
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.value_ = pMVar2;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).impl_.link_.next_ =
       &(__return_storage_ptr__->
        super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ).impl_.link_;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00292908;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<T>(impl_));
  }